

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

void __thiscall
despot::PlannerBase::DisplayParameters(PlannerBase *this,Option *options,DSPOMDP *model)

{
  ostream *poVar1;
  undefined8 uVar2;
  char *__s;
  char *__s_00;
  string ubtype;
  string lbtype;
  allocator<char> local_59;
  allocator<char> local_58 [32];
  string local_38 [32];
  
  __s_00 = "DEFAULT";
  __s = "DEFAULT";
  if (options[0x13].desc != (Descriptor *)0x0) {
    __s = options[0x13].arg;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,local_58);
  if (options[0x15].desc != (Descriptor *)0x0) {
    __s_00 = options[0x15].arg;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s_00,&local_59);
  if (DAT_0019fe20 == '\0') {
    poVar1 = std::operator<<((ostream *)&std::cout,"Model = ");
    if (model == (DSPOMDP *)0x0) {
      uVar2 = __cxa_bad_typeid();
      std::__cxx11::string::~string(local_38);
      _Unwind_Resume(uVar2);
    }
    poVar1 = std::operator<<(poVar1,*(char **)(model->_vptr_DSPOMDP[-1] + 8) +
                                    (**(char **)(model->_vptr_DSPOMDP[-1] + 8) == '*'));
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Random root seed = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Search depth = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,DAT_0019fdd0);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<(poVar1,"Discount = ");
    poVar1 = std::ostream::_M_insert<double>(DAT_0019fdd8);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Simulation steps = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,DAT_0019fdc8);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Number of scenarios = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,DAT_0019fdcc);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<(poVar1,"Search time per step = ");
    poVar1 = std::ostream::_M_insert<double>(Globals::config);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<(poVar1,"Regularization constant = ");
    poVar1 = std::ostream::_M_insert<double>(DAT_0019fde0);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Lower bound = ");
    poVar1 = std::operator<<(poVar1,local_38);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Upper bound = ");
    poVar1 = std::operator<<(poVar1,(string *)local_58);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Policy simulation depth = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,DAT_0019fdd4);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<(poVar1,"Target gap ratio = ");
    poVar1 = std::ostream::_M_insert<double>(DAT_0019fde8);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PlannerBase::DisplayParameters(option::Option *options, DSPOMDP *model) {

	string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
	string ubtype = options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
	default_out<< "Model = " << typeid(*model).name() << endl
	<< "Random root seed = " << Globals::config.root_seed << endl
	<< "Search depth = " << Globals::config.search_depth << endl
	<< "Discount = " << Globals::config.discount << endl
	<< "Simulation steps = " << Globals::config.sim_len << endl
	<< "Number of scenarios = " << Globals::config.num_scenarios
	<< endl
	<< "Search time per step = " << Globals::config.time_per_move
	<< endl
	<< "Regularization constant = "
	<< Globals::config.pruning_constant << endl
	<< "Lower bound = " << lbtype << endl
	<< "Upper bound = " << ubtype << endl
	<< "Policy simulation depth = "
	<< Globals::config.max_policy_sim_len << endl
	<< "Target gap ratio = " << Globals::config.xi << endl;
	// << "Solver = " << typeid(*solver).name() << endl << endl;
}